

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

us_socket_t *
us_socket_context_adopt_socket(int ssl,us_socket_context_t *context,us_socket_t *s,int ext_size)

{
  int iVar1;
  us_internal_ssl_socket_t *puVar2;
  
  if (ssl != 0) {
    puVar2 = us_internal_ssl_socket_context_adopt_socket
                       ((us_internal_ssl_socket_context_t *)context,(us_internal_ssl_socket_t *)s,
                        ext_size);
    return &puVar2->s;
  }
  iVar1 = us_socket_is_closed(0,s);
  if (iVar1 == 0) {
    us_internal_socket_context_unlink(s->context,s);
    s = (us_socket_t *)us_poll_resize(&s->p,s->context->loop,ext_size + 0x30);
    us_internal_socket_context_link(context,s);
  }
  return s;
}

Assistant:

struct us_socket_t *us_socket_context_adopt_socket(int ssl, struct us_socket_context_t *context, struct us_socket_t *s, int ext_size) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        return (struct us_socket_t *) us_internal_ssl_socket_context_adopt_socket((struct us_internal_ssl_socket_context_t *) context, (struct us_internal_ssl_socket_t *) s, ext_size);
    }
#endif

    /* Cannot adopt a closed socket */
    if (us_socket_is_closed(ssl, s)) {
        return s;
    }

    /* This properly updates the iterator if in on_timeout */
    us_internal_socket_context_unlink(s->context, s);

    struct us_socket_t *new_s = (struct us_socket_t *) us_poll_resize(&s->p, s->context->loop, sizeof(struct us_socket_t) + ext_size);

    us_internal_socket_context_link(context, new_s);

    return new_s;
}